

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O2

void archivateFiles(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *filesToArchivate,string *pathToOutArchive)

{
  pointer pbVar1;
  __off_t __n;
  uint uVar2;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> _Var3;
  ulong uVar4;
  size_t sVar5;
  CpioException *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  char additionalNullTerminator;
  DescriptorWrapper fdArch;
  DescriptorWrapper local_118;
  DescriptorWrapper fdToArchivate;
  __array bufPtr;
  header_old_cpio header;
  stat st;
  
  pbVar1 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (filesToArchivate->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    DescriptorWrapper::openFile((DescriptorWrapper *)&st,pbVar6,0);
    DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)&st);
  }
  DescriptorWrapper::createFile(&fdArch,pathToOutArchive,0x41,0x1b4);
  additionalNullTerminator = '\0';
  pbVar6 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar6 == pbVar1) {
      local_118.m_fd = fdArch.m_fd;
      writeTrailer(&local_118);
      DescriptorWrapper::~DescriptorWrapper(&local_118);
      DescriptorWrapper::~DescriptorWrapper(&fdArch);
      return;
    }
    PosixWrapper::lstat_(pbVar6,&st);
    fillInHeader(&header,&st,pbVar6);
    DescriptorWrapper::writeFrom(&fdArch,&header,0x1a);
    DescriptorWrapper::writeFrom(&fdArch,(pbVar6->_M_dataplus)._M_p,(ulong)header.c_namesize);
    if ((header.c_namesize & 1) != 0) {
      DescriptorWrapper::writeFrom(&fdArch,&additionalNullTerminator,1);
    }
    __n = st.st_size;
    uVar2 = header.c_mode - 0x1000 >> 0xc;
    if (0xb < uVar2) break;
    if ((0x82bU >> (uVar2 & 0x1f) & 1) == 0) {
      if (uVar2 == 7) {
        DescriptorWrapper::openFile(&fdToArchivate,pbVar6,0);
        uVar4 = st.st_size;
        _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(0x200);
        memset((void *)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,0,0x200);
        bufPtr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        for (; 0 < (long)uVar4; uVar4 = uVar4 - sVar5) {
          sVar5 = 0x200;
          if (uVar4 < 0x200) {
            sVar5 = uVar4;
          }
          sVar5 = DescriptorWrapper::readTo
                            (&fdToArchivate,
                             (void *)bufPtr._M_t.
                                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                     super__Head_base<0UL,_char_*,_false>._M_head_impl,sVar5);
          DescriptorWrapper::writeFrom
                    (&fdArch,(void *)bufPtr._M_t.
                                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                     super__Head_base<0UL,_char_*,_false>._M_head_impl,sVar5);
        }
        if ((st.st_size & 0x8000000000000001U) == 1) {
          DescriptorWrapper::writeFrom(&fdArch,&additionalNullTerminator,1);
        }
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&bufPtr);
        DescriptorWrapper::~DescriptorWrapper(&fdToArchivate);
      }
      else {
        if (uVar2 != 9) break;
        _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(st.st_size);
        memset((void *)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
        bufPtr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
             _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        uVar4 = PosixWrapper::readlink_
                          (pbVar6,(char *)_Var3.
                                          super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                          .super__Head_base<0UL,_char_*,_false>._M_head_impl,__n);
        DescriptorWrapper::writeFrom
                  (&fdArch,(void *)bufPtr._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl,uVar4);
        if ((uVar4 & 0x8000000000000001) == 1) {
          DescriptorWrapper::writeFrom(&fdArch,&additionalNullTerminator,1);
        }
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&bufPtr);
      }
    }
    pbVar6 = pbVar6 + 1;
  }
  this = (CpioException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufPtr,"Unknown filetype",(allocator<char> *)&fdToArchivate);
  CpioException::CpioException(this,InvalidInputFileToArchive,(string *)&bufPtr);
  __cxa_throw(this,&CpioException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void archivateFiles(const vector<string>& filesToArchivate, const string& pathToOutArchive) 
{
	// check all files can be opened
	for (const auto& filename: filesToArchivate) {
		DescriptorWrapper fd = DescriptorWrapper::openFile(filename, O_RDONLY);
	}

	auto fdArch = DescriptorWrapper::createFile(pathToOutArchive, O_WRONLY | O_CREAT, ACCESS_RW_RW_R__);
	header_old_cpio header;
	char additionalNullTerminator = 0;
	struct stat st;

	try
	{
		for (const auto& filename: filesToArchivate) {
			PosixWrapper::lstat_(filename, st);
			fillInHeader(header, st, filename);
			// write header 
			fdArch.writeFrom(&header, sizeof(header_old_cpio));
			// write filename
			fdArch.writeFrom((void*)filename.c_str(), header.c_namesize);
			if (header.c_namesize % 2 == 1)
				fdArch.writeFrom(&additionalNullTerminator, 1);
			// write file content 
			switch (header.c_mode & CP_IFMT) {
		    	case S_IFDIR:
				case S_IFCHR:
		    	case S_IFBLK:
		    	case S_IFSOCK:
		    	case S_IFIFO:
		    	{
		    		break;
		    	}
		    	case S_IFLNK:
		    	{
		    		auto bufPtr = make_unique<char[]>(st.st_size);
	    			auto size = PosixWrapper::readlink_(filename, bufPtr.get(), st.st_size);
	    			fdArch.writeFrom(bufPtr.get(), size);
	    			if (size % 2 == 1)
	    				fdArch.writeFrom(&additionalNullTerminator, 1);
		    		
		    		break;
		    	}
		    	case S_IFREG:
		    	{
					auto fdToArchivate = DescriptorWrapper::openFile(filename, O_RDONLY); 
					auto leftToCopy = st.st_size;
					auto bufPtr = make_unique<char[]>(BUFFER_BLOCK);
					while (leftToCopy > 0)
					{
						auto sz = fdToArchivate.readTo(bufPtr.get(), min<unsigned long>(BUFFER_BLOCK, leftToCopy));
						fdArch.writeFrom(bufPtr.get(), sz);
						leftToCopy -= sz;
					}
					if (st.st_size % 2 == 1)
						fdArch.writeFrom(&additionalNullTerminator, 1);
					
					break;
				}
				default:
				{
					throw CpioException(CpioException::InvalidInputFileToArchive, "Unknown filetype");
				}
			}
		}

		writeTrailer(fdArch);
	}
	catch (exception& e) 
	{
		unlink(pathToOutArchive.c_str());
		throw;
	}

	return;
}